

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int MemHashAppend(unqlite_kv_engine *pKv,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  sxu32 sVar1;
  mem_hash_record *pmVar2;
  unqlite_kv_io *puVar3;
  void *pvVar4;
  int iVar5;
  char *pcVar6;
  unqlite_kv_handle pvVar7;
  long lVar8;
  
  if (nDataLen < 0x100000000) {
    pmVar2 = MemHashGetEntry((mem_hash_kv_engine *)pKv,pKey,nKeyLen);
    if (pmVar2 == (mem_hash_record *)0x0) {
      sVar1 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
      pmVar2 = MemHashNewRecord((mem_hash_kv_engine *)pKv,pKey,nKeyLen,pData,nDataLen,sVar1);
      if (pmVar2 != (mem_hash_record *)0x0) {
        MemHashLinkRecord((mem_hash_kv_engine *)pKv,pmVar2);
        if (99999 < *(uint *)&pKv[0x1a].pIo) {
          return 0;
        }
        if (*(uint *)&pKv[0x1a].pIo << 2 < *(uint *)((long)&pKv[0x1a].pIo + 4)) {
          return 0;
        }
        MemHashGrowTable((mem_hash_kv_engine *)pKv);
        return 0;
      }
    }
    else {
      lVar8 = (ulong)pmVar2->nDataLen + nDataLen;
      if (0xffffffff < lVar8) {
        puVar3 = pKv->pIo;
        pvVar7 = puVar3->pHandle;
        pcVar6 = "Append operation will cause data overflow";
        goto LAB_00111622;
      }
      sVar1 = (sxu32)lVar8;
      pvVar4 = SyMemBackendRealloc((SyMemBackend *)(pKv + 1),pmVar2->pData,sVar1);
      if (pvVar4 != (void *)0x0) {
        SyMemcpy(pData,(void *)((ulong)pmVar2->nDataLen + (long)pvVar4),(sxu32)nDataLen);
        pmVar2->pData = pvVar4;
        pmVar2->nDataLen = sVar1;
        return 0;
      }
    }
    iVar5 = -1;
  }
  else {
    puVar3 = pKv->pIo;
    pvVar7 = puVar3->pHandle;
    pcVar6 = "Record size limit reached";
LAB_00111622:
    (*puVar3->xErr)(pvVar7,pcVar6);
    iVar5 = -7;
  }
  return iVar5;
}

Assistant:

static int MemHashAppend(
	  unqlite_kv_engine *pKv,
	  const void *pKey,int nKeyLen,
	  const void *pData,unqlite_int64 nDataLen
	  )
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKv;
	mem_hash_record *pRecord;
	if( nDataLen > SXU32_HIGH ){
		/* Database limit */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Record size limit reached");
		return UNQLITE_LIMIT;
	}
	/* Fetch the record first */
	pRecord = MemHashGetEntry(pEngine,pKey,nKeyLen);
	if( pRecord == 0 ){
		/* Allocate a new record */
		pRecord = MemHashNewRecord(pEngine,
			pKey,nKeyLen,
			pData,nDataLen,
			pEngine->xHash(pKey,nKeyLen)
			);
		if( pRecord == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Link the entry */
		MemHashLinkRecord(pEngine,pRecord);
		if( pEngine->nRecord * MEM_HASH_FILL_FACTOR >= pEngine->nBucket && pEngine->nRecord < 100000 ){
			/* Rehash the table */
			MemHashGrowTable(pEngine);
		}
	}else{
		unqlite_int64 nNew = pRecord->nDataLen + nDataLen;
		void *pOld = (void *)pRecord->pData;
		sxu32 nData;
		char *zNew;
		/* Append data to the existing record */
		if( nNew > SXU32_HIGH ){
			/* Overflow */
			pEngine->pIo->xErr(pEngine->pIo->pHandle,"Append operation will cause data overflow");	
			return UNQLITE_LIMIT;
		}
		nData = (sxu32)nNew;
		/* Allocate bigger chunk */
		zNew = (char *)SyMemBackendRealloc(&pEngine->sAlloc,pOld,nData);
		if( zNew == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Reflect the change */
		SyMemcpy(pData,&zNew[pRecord->nDataLen],(sxu32)nDataLen);
		pRecord->pData = (const void *)zNew;
		pRecord->nDataLen = nData;
	}
	return UNQLITE_OK;
}